

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.hpp
# Opt level: O0

void mxx::
     global_scan_inplace<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::plus<int>>
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> begin,
               __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end,byte param_3,
               int *param_4)

{
  int iVar1;
  ulong uVar2;
  reference piVar3;
  ulong local_a8;
  size_t i;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Stack_98;
  T presum;
  int local_90 [2];
  T sum;
  int *local_78;
  int *local_70;
  undefined1 local_68 [8];
  comm nonzero_comm;
  size_t n;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> o;
  comm *comm_local;
  bool commutative_local;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Stack_18;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end_local;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> begin_local;
  
  comm_local._6_1_ = param_3 & 1;
  nonzero_comm._24_8_ = end._M_current;
  n = (size_t)begin._M_current;
  o._M_current = param_4;
  _Stack_18._M_current = end._M_current;
  end_local._M_current = begin._M_current;
  uVar2 = std::distance<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                    (begin,end);
  comm::split((comm *)local_68,(comm *)o._M_current,(uint)(uVar2 != 0));
  if (uVar2 != 0) {
    local_70 = end_local._M_current;
    local_78 = _Stack_18._M_current;
    local_scan_inplace<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,std::plus<int>>
              (end_local._M_current,_Stack_18._M_current);
    _Stack_98 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                operator+(&end_local,uVar2 - 1);
    piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&stack0xffffffffffffff68);
    local_90[0] = *piVar3;
    i._4_4_ = exscan<int,std::plus<int>>(local_90,local_68,comm_local._6_1_ & 1);
    iVar1 = comm::rank((comm *)local_68);
    if (iVar1 != 0) {
      for (local_a8 = 0; local_a8 < uVar2; local_a8 = local_a8 + 1) {
        piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                 operator*((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)&n);
        iVar1 = std::plus<int>::operator()
                          ((plus<int> *)((long)&comm_local + 7),(int *)((long)&i + 4),piVar3);
        piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                 operator*((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)&n);
        *piVar3 = iVar1;
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                  ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)&n);
      }
    }
  }
  comm::~comm((comm *)local_68);
  return;
}

Assistant:

inline void global_scan_inplace(Iterator begin, Iterator end, Func func, const bool commutative, const mxx::comm& comm = mxx::comm()) {
    Iterator o = begin;
    size_t n = std::distance(begin, end);
    mxx::comm nonzero_comm = comm.split(n > 0);
    if (n > 0) {
        // local inplace scan
        local_scan_inplace(begin, end, func);
        // mxx::exscan
        typedef typename std::iterator_traits<Iterator>::value_type T;
        T sum = *(begin + (n-1));
        T presum = exscan(sum, func, nonzero_comm, commutative);

        if (nonzero_comm.rank() != 0) {
            // accumulate previous sum on all local elements
            for (size_t i = 0; i < n; ++i) {
                *o = func(presum, *o);
                ++o;
            }
        }
    }
}